

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3GetCollSeq(Parse *pParse,u8 enc,CollSeq *pColl,char *zName)

{
  sqlite3 *db_00;
  int iVar1;
  sqlite3 *db;
  CollSeq *p;
  char *zName_local;
  CollSeq *pColl_local;
  u8 enc_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  db = (sqlite3 *)pColl;
  if (pColl == (CollSeq *)0x0) {
    db = (sqlite3 *)sqlite3FindCollSeq(db_00,enc,zName,0);
  }
  if ((db == (sqlite3 *)0x0) || (db->mutex == (sqlite3_mutex *)0x0)) {
    callCollNeeded(db_00,(uint)enc,zName);
    db = (sqlite3 *)sqlite3FindCollSeq(db_00,enc,zName,0);
  }
  if ((db != (sqlite3 *)0x0) && (db->mutex == (sqlite3_mutex *)0x0)) {
    iVar1 = synthCollSeq(db_00,(CollSeq *)db);
    if (iVar1 != 0) {
      db = (sqlite3 *)0x0;
    }
  }
  if (db == (sqlite3 *)0x0) {
    sqlite3ErrorMsg(pParse,"no such collation sequence: %s",zName);
  }
  return (CollSeq *)db;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3GetCollSeq(
  Parse *pParse,        /* Parsing context */
  u8 enc,               /* The desired encoding for the collating sequence */
  CollSeq *pColl,       /* Collating sequence with native encoding, or NULL */
  const char *zName     /* Collating sequence name */
){
  CollSeq *p;
  sqlite3 *db = pParse->db;

  p = pColl;
  if( !p ){
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( !p || !p->xCmp ){
    /* No collation sequence of this type for this encoding is registered.
    ** Call the collation factory to see if it can supply us with one.
    */
    callCollNeeded(db, enc, zName);
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( p && !p->xCmp && synthCollSeq(db, p) ){
    p = 0;
  }
  assert( !p || p->xCmp );
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such collation sequence: %s", zName);
  }
  return p;
}